

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Updater.cpp
# Opt level: O2

void __thiscall Updater::onReply(Updater *this,QNetworkReply *reply)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_70;
  QJsonObject platform;
  QArrayDataPointer<char16_t> local_50;
  QJsonDocument document;
  QUrl redirect;
  QJsonObject updates;
  
  QNetworkReply::attribute((Attribute)&local_98);
  QVariant::toUrl();
  QVariant::~QVariant((QVariant *)&local_98);
  cVar4 = QUrl::isEmpty();
  if (cVar4 == '\0') {
    QUrl::toString(&local_98,&redirect,0);
    QString::operator=(&this->m_url,(QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    checkForUpdates(this);
  }
  else {
    iVar6 = QNetworkReply::error();
    if (iVar6 == 0) {
      if (this->m_customAppcast != true) {
        QIODevice::readAll();
        QJsonDocument::fromJson((QByteArray *)&document,(QJsonParseError *)&local_98);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
        cVar4 = QJsonDocument::isNull();
        if (cVar4 == '\0') {
          QJsonDocument::object();
          QString::QString((QString *)&local_70,"updates");
          QJsonObject::value((QString *)&local_98);
          QJsonValue::toObject();
          QJsonValue::~QJsonValue((QJsonValue *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          QJsonObject::~QJsonObject((QJsonObject *)&local_50);
          local_70.d = (this->m_platform).d.d;
          local_70.ptr = (this->m_platform).d.ptr;
          local_70.size = (this->m_platform).d.size;
          if (local_70.d != (Data *)0x0) {
            LOCK();
            ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QJsonObject::value((QString *)&local_98);
          QJsonValue::toObject();
          QJsonValue::~QJsonValue((QJsonValue *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          QString::QString((QString *)&local_50,"open-url");
          QJsonObject::value((QString *)&local_70);
          QJsonValue::toString();
          pDVar2 = (this->m_openUrl).d.d;
          pcVar3 = (this->m_openUrl).d.ptr;
          (this->m_openUrl).d.d = local_98.d;
          (this->m_openUrl).d.ptr = local_98.ptr;
          qVar1 = (this->m_openUrl).d.size;
          (this->m_openUrl).d.size = local_98.size;
          local_98.d = pDVar2;
          local_98.ptr = pcVar3;
          local_98.size = qVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QJsonValue::~QJsonValue((QJsonValue *)&local_70);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          QString::QString((QString *)&local_50,"changelog");
          QJsonObject::value((QString *)&local_70);
          QJsonValue::toString();
          pDVar2 = (this->m_changelog).d.d;
          pcVar3 = (this->m_changelog).d.ptr;
          (this->m_changelog).d.d = local_98.d;
          (this->m_changelog).d.ptr = local_98.ptr;
          qVar1 = (this->m_changelog).d.size;
          (this->m_changelog).d.size = local_98.size;
          local_98.d = pDVar2;
          local_98.ptr = pcVar3;
          local_98.size = qVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QJsonValue::~QJsonValue((QJsonValue *)&local_70);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          QString::QString((QString *)&local_50,"download-url");
          QJsonObject::value((QString *)&local_70);
          QJsonValue::toString();
          pDVar2 = (this->m_downloadUrl).d.d;
          pcVar3 = (this->m_downloadUrl).d.ptr;
          (this->m_downloadUrl).d.d = local_98.d;
          (this->m_downloadUrl).d.ptr = local_98.ptr;
          qVar1 = (this->m_downloadUrl).d.size;
          (this->m_downloadUrl).d.size = local_98.size;
          local_98.d = pDVar2;
          local_98.ptr = pcVar3;
          local_98.size = qVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QJsonValue::~QJsonValue((QJsonValue *)&local_70);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          QString::QString((QString *)&local_50,"latest-version");
          QJsonObject::value((QString *)&local_70);
          QJsonValue::toString();
          pDVar2 = (this->m_latestVersion).d.d;
          pcVar3 = (this->m_latestVersion).d.ptr;
          (this->m_latestVersion).d.d = local_98.d;
          (this->m_latestVersion).d.ptr = local_98.ptr;
          qVar1 = (this->m_latestVersion).d.size;
          (this->m_latestVersion).d.size = local_98.size;
          local_98.d = pDVar2;
          local_98.ptr = pcVar3;
          local_98.size = qVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QJsonValue::~QJsonValue((QJsonValue *)&local_70);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          QString::QString((QString *)&local_98,"mandatory-update");
          cVar4 = QJsonObject::contains((QString *)&platform);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          if (cVar4 != '\0') {
            QString::QString((QString *)&local_70,"mandatory-update");
            QJsonObject::value((QString *)&local_98);
            bVar5 = (bool)QJsonValue::toBool(SUB81(&local_98,0));
            this->m_mandatoryUpdate = bVar5;
            QJsonValue::~QJsonValue((QJsonValue *)&local_98);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          }
          local_98.d = (this->m_latestVersion).d.d;
          local_98.ptr = (this->m_latestVersion).d.ptr;
          local_98.size = (this->m_latestVersion).d.size;
          if (local_98.d != (Data *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_70.d = (this->m_moduleVersion).d.d;
          local_70.ptr = (this->m_moduleVersion).d.ptr;
          local_70.size = (this->m_moduleVersion).d.size;
          if (local_70.d != (Data *)0x0) {
            LOCK();
            ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          bVar5 = QSimpleUpdater::compareVersions((QString *)&local_98,(QString *)&local_70);
          setUpdateAvailable(this,bVar5);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          local_98.d = (this->m_url).d.d;
          local_98.ptr = (this->m_url).d.ptr;
          local_98.size = (this->m_url).d.size;
          if (local_98.d != (Data *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          checkingFinished(this,(QString *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QJsonObject::~QJsonObject(&platform);
          QJsonObject::~QJsonObject(&updates);
        }
        else {
          setUpdateAvailable(this,false);
          local_98.d = (this->m_url).d.d;
          local_98.ptr = (this->m_url).d.ptr;
          local_98.size = (this->m_url).d.size;
          if (local_98.d != (Data *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          checkingFinished(this,(QString *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        }
        QJsonDocument::~QJsonDocument(&document);
        goto LAB_0010e576;
      }
      local_98.d = (this->m_url).d.d;
      local_98.ptr = (this->m_url).d.ptr;
      local_98.size = (this->m_url).d.size;
      if (local_98.d != (Data *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QIODevice::readAll();
      appcastDownloaded(this,(QString *)&local_98,(QByteArray *)&local_70);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      local_98.d = (this->m_url).d.d;
      local_98.ptr = (this->m_url).d.ptr;
      local_98.size = (this->m_url).d.size;
      if (local_98.d != (Data *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      checkingFinished(this,(QString *)&local_98);
    }
    else {
      setUpdateAvailable(this,false);
      local_98.d = (this->m_url).d.d;
      local_98.ptr = (this->m_url).d.ptr;
      local_98.size = (this->m_url).d.size;
      if (local_98.d != (Data *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      checkingFinished(this,(QString *)&local_98);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
LAB_0010e576:
  QUrl::~QUrl(&redirect);
  return;
}

Assistant:

void Updater::onReply(QNetworkReply *reply)
{
   /* Check if we need to redirect */
   QUrl redirect = reply->attribute(QNetworkRequest::RedirectionTargetAttribute).toUrl();
   if (!redirect.isEmpty())
   {
      setUrl(redirect.toString());
      checkForUpdates();
      return;
   }

   /* There was a network error */
   if (reply->error() != QNetworkReply::NoError)
   {
      setUpdateAvailable(false);
      emit checkingFinished(url());
      return;
   }

   /* The application wants to interpret the appcast by itself */
   if (customAppcast())
   {
      emit appcastDownloaded(url(), reply->readAll());
      emit checkingFinished(url());
      return;
   }

   /* Try to create a JSON document from downloaded data */
   QJsonDocument document = QJsonDocument::fromJson(reply->readAll());

   /* JSON is invalid */
   if (document.isNull())
   {
      setUpdateAvailable(false);
      emit checkingFinished(url());
      return;
   }

   /* Get the platform information */
   QJsonObject updates = document.object().value("updates").toObject();
   QJsonObject platform = updates.value(platformKey()).toObject();

   /* Get update information */
   m_openUrl = platform.value("open-url").toString();
   m_changelog = platform.value("changelog").toString();
   m_downloadUrl = platform.value("download-url").toString();
   m_latestVersion = platform.value("latest-version").toString();
   if (platform.contains("mandatory-update"))
      m_mandatoryUpdate = platform.value("mandatory-update").toBool();

   /* Compare latest and current version */
   setUpdateAvailable(compare(latestVersion(), moduleVersion()));
   emit checkingFinished(url());
}